

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingPropertyExprSyntax,slang::syntax::TimingControlSyntax&,slang::syntax::PropertyExprSyntax*&>
          (BumpAllocator *this,TimingControlSyntax *args,PropertyExprSyntax **args_1)

{
  ClockingPropertyExprSyntax *this_00;
  PropertyExprSyntax **args_local_1;
  TimingControlSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ClockingPropertyExprSyntax *)allocate(this,0x20,8);
  slang::syntax::ClockingPropertyExprSyntax::ClockingPropertyExprSyntax(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }